

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprToRegister(Expr *pExpr,int iReg)

{
  byte *pbVar1;
  Expr *pEVar2;
  
  pEVar2 = sqlite3ExprSkipCollateAndLikely(pExpr);
  if ((pEVar2 != (Expr *)0x0) && (pEVar2->op != 0xb0)) {
    pEVar2->op2 = pEVar2->op;
    pEVar2->op = 0xb0;
    pEVar2->iTable = iReg;
    pbVar1 = (byte *)((long)&pEVar2->flags + 1);
    *pbVar1 = *pbVar1 & 0xdf;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprToRegister(Expr *pExpr, int iReg){
  Expr *p = sqlite3ExprSkipCollateAndLikely(pExpr);
  if( NEVER(p==0) ) return;
  if( p->op==TK_REGISTER ){
    assert( p->iTable==iReg );
  }else{
    p->op2 = p->op;
    p->op = TK_REGISTER;
    p->iTable = iReg;
    ExprClearProperty(p, EP_Skip);
  }
}